

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall Win32MakefileGenerator::processVars(Win32MakefileGenerator *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  iterator o;
  ulong uVar5;
  long in_RDI;
  long in_FS_OFFSET;
  ProStringList *qmklibs;
  ProStringList *libDir;
  QString lib;
  Iterator libDir_it;
  ProStringList libs;
  QStringList l;
  undefined4 in_stack_fffffffffffff1c8;
  SplitBehaviorFlags in_stack_fffffffffffff1cc;
  QMakeProject *in_stack_fffffffffffff1d0;
  QMakeProject *this_00;
  QMakeProject *in_stack_fffffffffffff1d8;
  ProString *in_stack_fffffffffffff1e0;
  QMakeProject *in_stack_fffffffffffff1e8;
  char *in_stack_fffffffffffff208;
  byte local_d72;
  bool local_d59;
  Win32MakefileGenerator *in_stack_fffffffffffff2b0;
  byte local_ca1;
  Win32MakefileGenerator *in_stack_fffffffffffff4f8;
  QChar local_692;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  iterator local_678 [7];
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  QChar local_45a [49];
  undefined1 local_3f8 [24];
  QList<QString> local_3e0 [41];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                 (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
  QMakeEvaluator::first
            (&in_stack_fffffffffffff1e8->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff1e0);
  bVar2 = ProString::endsWith(in_stack_fffffffffffff1e0,(char *)in_stack_fffffffffffff1d8,
                              (CaseSensitivity)((ulong)in_stack_fffffffffffff1d0 >> 0x20));
  ProString::~ProString((ProString *)0x2af1e1);
  ProKey::~ProKey((ProKey *)0x2af1ee);
  if (!bVar2) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffff1d0,
               (ProStringList *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffff1d0,
               (ProStringList *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::~ProKey((ProKey *)0x2af303);
    ProKey::~ProKey((ProKey *)0x2af310);
    ProKey::~ProKey((ProKey *)0x2af31d);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    bVar2 = QMakeProject::isEmpty(in_stack_fffffffffffff1e8,(ProKey *)in_stack_fffffffffffff1e0);
    ProKey::~ProKey((ProKey *)0x2af371);
    if (bVar2) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProStringList::operator=
                ((ProStringList *)in_stack_fffffffffffff1d0,
                 (ProStringList *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::~ProKey((ProKey *)0x2af429);
      ProKey::~ProKey((ProKey *)0x2af436);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeEvaluator::first
                (&in_stack_fffffffffffff1e8->super_QMakeEvaluator,
                 (ProKey *)in_stack_fffffffffffff1e0);
      bVar2 = ProString::startsWith
                        (in_stack_fffffffffffff1e0,(char *)in_stack_fffffffffffff1d8,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffff1d0 >> 0x20));
      ProString::~ProString((ProString *)0x2af4b0);
      ProKey::~ProKey((ProKey *)0x2af4bd);
      if (bVar2) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                       (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QMakeProject::values
                  (in_stack_fffffffffffff1d0,
                   (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                       (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QMakeProject::values
                  (in_stack_fffffffffffff1d0,
                   (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProStringList::operator=
                  ((ProStringList *)in_stack_fffffffffffff1d0,
                   (ProStringList *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProKey::~ProKey((ProKey *)0x2af575);
        ProKey::~ProKey((ProKey *)0x2af582);
      }
    }
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_fffffffffffff1d0,
               (QList<ProString> *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::~ProKey((ProKey *)0x2af62c);
    ProKey::~ProKey((ProKey *)0x2af639);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_fffffffffffff1d0,
               (QList<ProString> *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::~ProKey((ProKey *)0x2af6e1);
    ProKey::~ProKey((ProKey *)0x2af6ee);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x2af736);
    ProKey::~ProKey((ProKey *)0x2af74c);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_fffffffffffff1d0,
                 (QList<ProString> *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::~ProKey((ProKey *)0x2af804);
      ProKey::~ProKey((ProKey *)0x2af811);
    }
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x2af859);
    ProKey::~ProKey((ProKey *)0x2af86f);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      local_3e0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_3e0[0].d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_3e0[0].d.size = -0x5555555555555556;
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeEvaluator::first
                (&in_stack_fffffffffffff1e8->super_QMakeEvaluator,
                 (ProKey *)in_stack_fffffffffffff1e0);
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QChar::QChar<char,_true>(local_45a,'.');
      QFlags<Qt::SplitBehaviorFlags>::QFlags
                ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffff1d0,
                 in_stack_fffffffffffff1cc);
      QString::split((QChar)(char16_t)local_3e0,(QFlags_conflict *)local_3f8,
                     (uint)(ushort)local_45a[0].ucs);
      QString::~QString((QString *)0x2af964);
      ProString::~ProString((ProString *)0x2af971);
      ProKey::~ProKey((ProKey *)0x2af97e);
      qVar4 = QList<QString>::size(local_3e0);
      if (0 < qVar4) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                       (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QMakeProject::values
                  (in_stack_fffffffffffff1d0,
                   (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QList<QString>::operator[]
                  ((QList<QString> *)in_stack_fffffffffffff1d0,
                   CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProString::ProString
                  ((ProString *)in_stack_fffffffffffff1d0,
                   (QString *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QList<ProString>::append
                  ((QList<ProString> *)in_stack_fffffffffffff1d0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProString::~ProString((ProString *)0x2afa20);
        ProKey::~ProKey((ProKey *)0x2afa2d);
      }
      qVar4 = QList<QString>::size(local_3e0);
      if (1 < qVar4) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                       (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QMakeProject::values
                  (in_stack_fffffffffffff1d0,
                   (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QList<QString>::operator[]
                  ((QList<QString> *)in_stack_fffffffffffff1d0,
                   CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProString::ProString
                  ((ProString *)in_stack_fffffffffffff1d0,
                   (QString *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        QList<ProString>::append
                  ((QList<ProString> *)in_stack_fffffffffffff1d0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProString::~ProString((ProString *)0x2afad0);
        ProKey::~ProKey((ProKey *)0x2afadd);
      }
      QList<QString>::~QList((QList<QString> *)0x2afaea);
    }
    QString::QString((QString *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff208);
    bVar3 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff1d8,(QString *)in_stack_fffffffffffff1d0,
                       SUB41(in_stack_fffffffffffff1cc >> 0x18,0));
    bVar1 = false;
    bVar2 = false;
    local_ca1 = 0;
    if (!bVar3) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      bVar1 = true;
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x2afba0);
      local_ca1 = 0;
      if (bVar3) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                       (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        bVar2 = true;
        QMakeProject::values
                  (in_stack_fffffffffffff1d0,
                   (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x2afc02);
        local_ca1 = bVar3 ^ 0xff;
      }
    }
    if (bVar2) {
      ProKey::~ProKey((ProKey *)0x2afc32);
    }
    if (bVar1) {
      ProKey::~ProKey((ProKey *)0x2afc4b);
    }
    QString::~QString((QString *)0x2afc58);
    if ((local_ca1 & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeEvaluator::first
                (&in_stack_fffffffffffff1e8->super_QMakeEvaluator,
                 (ProKey *)in_stack_fffffffffffff1e0);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_fffffffffffff1d0,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProString::~ProString((ProString *)0x2afd1d);
      ProKey::~ProKey((ProKey *)0x2afd2a);
      ProKey::~ProKey((ProKey *)0x2afd37);
    }
    fixTargetExt(in_stack_fffffffffffff2b0);
    processRcFileVar(in_stack_fffffffffffff4f8);
    local_640 = 0xaaaaaaaaaaaaaaaa;
    local_638 = 0xaaaaaaaaaaaaaaaa;
    local_630 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x2afd8b);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::~ProKey((ProKey *)0x2afdf2);
    local_678[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_678[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff1d0);
    while( true ) {
      o = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff1d0);
      bVar2 = QList<ProString>::iterator::operator!=(local_678,o);
      if (!bVar2) break;
      local_690 = 0xaaaaaaaaaaaaaaaa;
      local_688 = 0xaaaaaaaaaaaaaaaa;
      local_680 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::iterator::operator*(local_678);
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      bVar2 = QString::isEmpty((QString *)0x2afeb0);
      if (!bVar2) {
        QChar::QChar<char,_true>(&local_692,'\\');
        uVar5 = QString::endsWith((QChar)(char16_t)&local_690,(uint)(ushort)local_692.ucs);
        if ((uVar5 & 1) != 0) {
          QString::chop((longlong)&local_690);
        }
        QLatin1String::QLatin1String
                  ((QLatin1String *)in_stack_fffffffffffff1e0,(char *)in_stack_fffffffffffff1d8);
        ::operator+((QLatin1String *)in_stack_fffffffffffff1d0,
                    (QString *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProString::ProString<QLatin1String,QString&>
                  (in_stack_fffffffffffff1e0,
                   (QStringBuilder<QLatin1String,_QString_&> *)in_stack_fffffffffffff1d8);
        ProStringList::operator<<
                  ((ProStringList *)in_stack_fffffffffffff1d0,
                   (ProString *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
        ProString::~ProString((ProString *)0x2aff64);
      }
      QString::~QString((QString *)0x2aff71);
      QList<ProString>::iterator::operator++(local_678);
    }
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProKey::~ProKey((ProKey *)0x2affea);
    ::operator+((ProStringList *)in_stack_fffffffffffff1e8,
                (ProStringList *)in_stack_fffffffffffff1e0);
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffff1d0,
               (ProStringList *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    ProStringList::~ProStringList((ProStringList *)0x2b0039);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                   (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    QMakeProject::values
              (in_stack_fffffffffffff1d0,
               (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
    bVar2 = ProStringList::contains
                      ((ProStringList *)in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,
                       (CaseSensitivity)((ulong)in_stack_fffffffffffff1d8 >> 0x20));
    ProKey::~ProKey((ProKey *)0x2b00a1);
    if (bVar2) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_fffffffffffff1d0,
                 (QList<ProString> *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::~ProKey((ProKey *)0x2b0159);
      ProKey::~ProKey((ProKey *)0x2b0166);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_fffffffffffff1d0,
                 (QList<ProString> *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::~ProKey((ProKey *)0x2b020e);
      ProKey::~ProKey((ProKey *)0x2b021b);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_fffffffffffff1d0,
                 (QList<ProString> *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      ProKey::~ProKey((ProKey *)0x2b02c3);
      ProKey::~ProKey((ProKey *)0x2b02d0);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                     (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      QMakeProject::values
                (in_stack_fffffffffffff1d0,
                 (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      bVar2 = ProStringList::contains
                        ((ProStringList *)in_stack_fffffffffffff1e8,
                         (char *)in_stack_fffffffffffff1e0,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffff1d8 >> 0x20));
      local_d59 = false;
      if (bVar2) {
        QString::QString((QString *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff208);
        local_d59 = QMakeProject::isActiveConfig
                              (in_stack_fffffffffffff1d8,(QString *)in_stack_fffffffffffff1d0,
                               SUB41(in_stack_fffffffffffff1cc >> 0x18,0));
        QString::~QString((QString *)0x2b03bb);
      }
      ProKey::~ProKey((ProKey *)0x2b03c8);
      if (local_d59 != false) {
        QString::QString((QString *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff208);
        bVar2 = QMakeProject::isActiveConfig
                          (in_stack_fffffffffffff1d8,(QString *)in_stack_fffffffffffff1d0,
                           SUB41(in_stack_fffffffffffff1cc >> 0x18,0));
        local_d72 = 1;
        if (bVar2) {
          QString::QString((QString *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff208);
          bVar2 = QMakeProject::isActiveConfig
                            (in_stack_fffffffffffff1d8,(QString *)in_stack_fffffffffffff1d0,
                             SUB41(in_stack_fffffffffffff1cc >> 0x18,0));
          local_d72 = bVar2 ^ 0xff;
          QString::~QString((QString *)0x2b04ae);
        }
        QString::~QString((QString *)0x2b04bb);
        if ((local_d72 & 1) != 0) {
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffff1d0,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::~ProKey((ProKey *)0x2b056d);
          ProKey::~ProKey((ProKey *)0x2b057a);
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffff1d0,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::~ProKey((ProKey *)0x2b0622);
          ProKey::~ProKey((ProKey *)0x2b062f);
        }
        QString::QString((QString *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff208);
        bVar2 = QMakeProject::isActiveConfig
                          (in_stack_fffffffffffff1d8,(QString *)in_stack_fffffffffffff1d0,
                           SUB41(in_stack_fffffffffffff1cc >> 0x18,0));
        QString::~QString((QString *)0x2b067c);
        if (bVar2) {
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffff1d0,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::~ProKey((ProKey *)0x2b071f);
          ProKey::~ProKey((ProKey *)0x2b072c);
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffff1d0,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::~ProKey((ProKey *)0x2b07c2);
          ProKey::~ProKey((ProKey *)0x2b07cf);
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff1d0,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (in_stack_fffffffffffff1d0,
                     (ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffff1d0,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::~ProKey((ProKey *)0x2b0865);
          ProKey::~ProKey((ProKey *)0x2b0872);
        }
        else {
          this_00 = *(QMakeProject **)(in_RDI + 0xd8);
          ProKey::ProKey((ProKey *)this_00,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (this_00,(ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8)
                    );
          ProKey::ProKey((ProKey *)this_00,
                         (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          QMakeProject::values
                    (this_00,(ProKey *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8)
                    );
          QList<ProString>::operator+=
                    ((QList<ProString> *)this_00,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
          ProKey::~ProKey((ProKey *)0x2b090d);
          ProKey::~ProKey((ProKey *)0x2b091a);
        }
      }
    }
    ProStringList::~ProStringList((ProStringList *)0x2b092b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::processVars()
{
    if (project->first("TEMPLATE").endsWith("aux"))
        return;

    project->values("PRL_TARGET") =
            project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");
    if (project->isEmpty("QMAKE_PROJECT_NAME"))
        project->values("QMAKE_PROJECT_NAME") = project->values("QMAKE_ORIG_TARGET");
    else if (project->first("TEMPLATE").startsWith("vc"))
        project->values("MAKEFILE") = project->values("QMAKE_PROJECT_NAME");

    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_LIBDIR") += project->values("QMAKE_LIBDIR_POST");

    if (!project->values("QMAKE_INCDIR").isEmpty())
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");

    if (!project->values("VERSION").isEmpty()) {
        QStringList l = project->first("VERSION").toQString().split('.');
        if (l.size() > 0)
            project->values("VER_MAJ").append(l[0]);
        if (l.size() > 1)
            project->values("VER_MIN").append(l[1]);
    }

    // TARGET_VERSION_EXT will be used to add a version number onto the target name
    if (!project->isActiveConfig("skip_target_version_ext")
        && project->values("TARGET_VERSION_EXT").isEmpty()
        && !project->values("VER_MAJ").isEmpty())
        project->values("TARGET_VERSION_EXT").append(project->first("VER_MAJ"));

    fixTargetExt();
    processRcFileVar();

    ProStringList libs;
    ProStringList &libDir = project->values("QMAKE_LIBDIR");
    for (ProStringList::Iterator libDir_it = libDir.begin(); libDir_it != libDir.end(); ++libDir_it) {
        QString lib = (*libDir_it).toQString();
        if (!lib.isEmpty()) {
            if (lib.endsWith('\\'))
                lib.chop(1);
            libs << QLatin1String("-L") + lib;
        }
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = libs + qmklibs;

    if (project->values("TEMPLATE").contains("app")) {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->values("TEMPLATE").contains("lib") && project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
        }
    }
}